

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-reincarnate.c
# Opt level: O0

void reincarnate_borg(void)

{
  ushort uVar1;
  chunk_conflict1 *pcVar2;
  loc lVar3;
  undefined6 uVar4;
  chunk_conflict *pcVar5;
  player *ppVar6;
  uint32_t uVar7;
  char *pcVar8;
  equip_slot *peVar9;
  player_body *ppVar10;
  undefined1 local_140 [8];
  command_conflict fake_cmd;
  player_class *p_class;
  player_race *p_race;
  loc sv_grid;
  chunk_conflict1 *sv_player_cave;
  chunk_conflict1 *sv_cave;
  player *p;
  char local_58 [4];
  wchar_t i;
  char buf [80];
  
  ppVar6 = player;
  pcVar5 = cave;
  pcVar2 = player->cave;
  lVar3 = player->grid;
  cave = (chunk_conflict *)0x0;
  player->cave = (chunk_conflict1 *)0x0;
  borg.trait[0x6a] = 0;
  borg.trait[0x24] = 1;
  borg_parse((char *)0x0);
  borg_clear_reactions();
  borg_flush();
  player_init(player);
  borg.trait[0x7b] = 0;
  borg.trait[0x78] = 0;
  borg.trait[0x76] = 0;
  borg.trait[0x75] = 0;
  borg.trait[0x74] = 0;
  borg.time_this_panel = 1;
  vault_on_level = false;
  unique_on_level = 0;
  scaryguy_on_level = false;
  breeder_level = false;
  borg.goal.leaving = false;
  borg.goal.fleeing = false;
  borg.goal.fleeing_to_town = false;
  borg.goal.ignoring = false;
  flavor_init();
  fake_cmd.arg[3].name[0x10] = '\0';
  fake_cmd.arg[3].name[0x11] = '\0';
  fake_cmd.arg[3].name[0x12] = '\0';
  fake_cmd.arg[3].name[0x13] = '\0';
  fake_cmd.arg[3]._36_4_ = 0;
  if (borg_cfg[0x15] == -1) {
    uVar7 = Rand_div(0xb);
    p_class = (player_class *)player_id2race(uVar7);
  }
  else {
    p_class = (player_class *)player_id2race(borg_cfg[0x15]);
  }
  if (borg_cfg[0x14] == -1) {
    uVar7 = Rand_div(9);
    fake_cmd.arg[3]._32_8_ = player_id2class(uVar7);
  }
  else {
    fake_cmd.arg[3]._32_8_ = player_id2class(borg_cfg[0x14]);
  }
  player_generate(player,(player_race *)p_class,(player_class *)fake_cmd.arg[3]._32_8_,false);
  character_dungeon = false;
  character_generated = false;
  player->depth = 0;
  seed_flavor = Rand_div(0x10000000);
  ppVar10 = bodies + ppVar6->race->body;
  (ppVar6->body).next = ppVar10->next;
  (ppVar6->body).name = ppVar10->name;
  uVar4 = *(undefined6 *)&ppVar10->field_0x12;
  (ppVar6->body).count = ppVar10->count;
  *(undefined6 *)&(ppVar6->body).field_0x12 = uVar4;
  (ppVar6->body).slots = ppVar10->slots;
  my_strcpy(local_58,bodies[ppVar6->race->body].name,0x50);
  pcVar8 = string_make(local_58);
  (ppVar6->body).name = pcVar8;
  peVar9 = (equip_slot *)mem_zalloc((ulong)(ppVar6->body).count << 5);
  (ppVar6->body).slots = peVar9;
  for (p._4_4_ = 0; p._4_4_ < (int)(uint)(ppVar6->body).count; p._4_4_ = p._4_4_ + 1) {
    (ppVar6->body).slots[p._4_4_].type = bodies[ppVar6->race->body].slots[p._4_4_].type;
    my_strcpy(local_58,bodies[ppVar6->race->body].slots[p._4_4_].name,0x50);
    pcVar8 = string_make(local_58);
    (ppVar6->body).slots[p._4_4_].name = pcVar8;
  }
  create_random_name(player->race->ridx,player->full_name,0x20);
  uVar1 = z_info->start_gold;
  player->au_birth = (uint)uVar1;
  player->au = (uint)uVar1;
  borg_roll_hp();
  player->obj_k->to_a = 1;
  player->obj_k->to_h = 1;
  player->obj_k->to_d = 1;
  player_learn_innate(player);
  player_spells_init(player);
  borg_outfit_player(player);
  player->upkeep->generate_level = true;
  player->upkeep->playing = true;
  my_strcpy((char *)&fake_cmd.arg[0].data.choice,"choice",0x14);
  fake_cmd.arg[0].type = arg_STRING;
  do_cmd_reset_stats((command_conflict *)local_140);
  store_reset();
  chunk_list_max = 0;
  cleanup_parser(&randart_parser);
  deactivate_randart_file();
  run_parser(&artifact_parser);
  if (((player->opts).opt[0x1e] & 1U) != 0) {
    seed_randart = Rand_div(0x10000000);
    do_randart(seed_randart,true);
    deactivate_randart_file();
  }
  Term_fresh();
  borg_prepare_race_class_info();
  borg_notice_player();
  borg_note("# Respawning");
  borg_respawning = 5;
  player->chp = player->mhp;
  player->csp = player->msp;
  player->upkeep->energy_use = L'd';
  ppVar6->upkeep->notice = 0;
  ppVar6->upkeep->update = 0;
  ppVar6->upkeep->redraw = 0;
  cave = pcVar5;
  player->cave = pcVar2;
  player->grid = lVar3;
  character_generated = true;
  if ((player->noscore & 0x20) == 0) {
    player->noscore = player->noscore | 0x20;
  }
  return;
}

Assistant:

void reincarnate_borg(void)
{
    char           buf[80];
    int            i;
    struct player *p = player;

    /* save the existing dungeon.  It is cleared later but needs to */
    /* be blank when  creating the new player */
    struct chunk* sv_cave = cave;
    struct chunk* sv_player_cave = player->cave;
    struct loc sv_grid = player->grid;

    cave = NULL;
    player->cave = NULL;

    /* Cheat death */
    borg.trait[BI_MAXDEPTH]  = 0;
    borg.trait[BI_MAXCLEVEL] = 1;

    /* Flush message buffer */
    borg_parse(NULL);
    borg_clear_reactions();

    /* flush the commands */
    borg_flush();

    /*** Wipe the player ***/
    player_init(player);

    borg.trait[BI_ISCUT] = borg.trait[BI_ISSTUN] = borg.trait[BI_ISHEAVYSTUN]
        = borg.trait[BI_ISIMAGE] = borg.trait[BI_ISSTUDY] = false;

    /* reset our panel clock */
    borg.time_this_panel = 1;

    /* reset our vault/unique check */
    vault_on_level    = false;
    unique_on_level   = 0;
    scaryguy_on_level = false;

    /* reset our breeder flag */
    breeder_level = false;

    /* Assume not leaving the level */
    borg.goal.leaving = false;

    /* Assume not fleeing the level */
    borg.goal.fleeing = false;

    /* Assume not fleeing the level */
    borg.goal.fleeing_to_town = false;

    /* Assume not ignoring monsters */
    borg.goal.ignoring = false;

    flavor_init();

    /** Roll up a new character **/
    struct player_race  *p_race  = NULL;
    struct player_class *p_class = NULL;
    if (borg_cfg[BORG_RESPAWN_RACE] != -1)
        p_race = player_id2race(borg_cfg[BORG_RESPAWN_RACE]);
    else
        p_race = player_id2race(randint0(MAX_RACES));
    if (borg_cfg[BORG_RESPAWN_CLASS] != -1)
        p_class = player_id2class(borg_cfg[BORG_RESPAWN_CLASS]);
    else
        p_class = player_id2class(randint0(MAX_CLASSES));
    player_generate(player, p_race, p_class, false);

    /* The dungeon is not ready nor is the player */
    character_dungeon   = false;
    character_generated = false;

    /* Start in town */
    player->depth = 0;

    /* Hack -- seed for flavors */
    seed_flavor = randint0(0x10000000);

    /* Embody */
    memcpy(&p->body, &bodies[p->race->body], sizeof(p->body));
    my_strcpy(buf, bodies[p->race->body].name, sizeof(buf));
    p->body.name  = string_make(buf);
    p->body.slots = mem_zalloc(p->body.count * sizeof(struct equip_slot));
    for (i = 0; i < p->body.count; i++) {
        p->body.slots[i].type = bodies[p->race->body].slots[i].type;
        my_strcpy(buf, bodies[p->race->body].slots[i].name, sizeof(buf));
        p->body.slots[i].name = string_make(buf);
    }

    /* Get a random name */
    create_random_name(
        player->race->ridx, player->full_name, sizeof(player->full_name));

    /* Give the player some money */
    player->au = player->au_birth = z_info->start_gold;

    /* Hack - need some HP */
    borg_roll_hp();

    /* Hack - player knows all combat runes.  Maybe make them not runes? NRM */
    player->obj_k->to_a = 1;
    player->obj_k->to_h = 1;
    player->obj_k->to_d = 1;

    /* Player learns innate runes */
    player_learn_innate(player);

    /* Initialise the spells */
    player_spells_init(player);

    /* outfit the player */
    borg_outfit_player(player);

    /* generate town */
    player->upkeep->generate_level = true;
    player->upkeep->playing        = true;

    struct command fake_cmd;
    /* fake up a command */
    my_strcpy(fake_cmd.arg[0].name, "choice", sizeof(fake_cmd.arg[0].name));
    fake_cmd.arg[0].data.choice = 1;
    do_cmd_reset_stats(&fake_cmd);

    /* Initialise the stores, dungeon */
    store_reset();
    chunk_list_max = 0;

    /* Restore the standard artifacts (randarts may have been loaded) */
    cleanup_parser(&randart_parser);
    deactivate_randart_file();
    run_parser(&artifact_parser);

    /* Now only randomize the artifacts if required */
    if (OPT(player, birth_randarts)) {
        seed_randart = randint0(0x10000000);
        do_randart(seed_randart, true);
        deactivate_randart_file();
    }

    /* Hack -- flush it */
    Term_fresh();

    /*** Hack -- react to race and class ***/

    /* Notice the new race and class */
    borg_prepare_race_class_info();

#if false
    /* need to check all stats */
    for (int tmp_i = 0; tmp_i < STAT_MAX; tmp_i++)
        my_need_stat_check[tmp_i] = true;
#endif

    borg_notice_player();

    /* Message */
    borg_note("# Respawning");
    borg_respawning = 5;

    /* fully healed and rested */
    player->chp = player->mhp;
    player->csp = player->msp;
    player->upkeep->energy_use = 100;

    /* don't notice or update immediately */
    p->upkeep->notice = 0;
    p->upkeep->update = 0;
    p->upkeep->redraw = 0;

    /* restore the cave */
    cave = sv_cave;
    player->cave = sv_player_cave;
    player->grid = sv_grid;

    /* the new player is now ready */
    character_generated = true;

    /* Mark savefile as borg cheater */
    if (!(player->noscore & NOSCORE_BORG))
        player->noscore |= NOSCORE_BORG;

    /* Done.  Play on */
}